

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_ssprk.c
# Opt level: O1

int compute_error(N_Vector y,sunrealtype t)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  
  dVar3 = atan(t);
  pdVar2 = (double *)N_VGetArrayPointer(y);
  iVar1 = fprintf(_stdout,"\nACCURACY at the final time = %g\n",ABS(*pdVar2 - dVar3));
  return iVar1;
}

Assistant:

static int compute_error(N_Vector y, sunrealtype t)
{
  sunrealtype ans, err; /* answer data, error */

  /* compute solution error */
  ans = ATAN(t);
  err = SUNRabs(N_VGetArrayPointer(y)[0] - ans);

  fprintf(stdout, "\nACCURACY at the final time = %" GSYM "\n", err);
  return 0;
}